

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFun.cpp
# Opt level: O1

double Imath_2_5::succd(double d)

{
  if ((~(ulong)d & 0x7ff0000000000000) != 0) {
    if ((d == 0.0) && (!NAN(d))) {
      return 4.94065645841247e-324;
    }
    if (d <= 0.0) {
      d = (double)((long)d + -1);
    }
    else {
      d = (double)((long)d + 1);
    }
  }
  return d;
}

Assistant:

double
succd (double d)
{
    union {double d; Int64 i;} u;
    u.d = d;

    if ((u.i & 0x7ff0000000000000LL) == 0x7ff0000000000000LL)
    {
        // Nan or infinity; don't change value.
    }
    else if (u.i == 0x0000000000000000LL || u.i == 0x8000000000000000LL)
    {
        // Plus or minus zero.

        u.i = 0x0000000000000001LL;
    }
    else if (u.d > 0)
    {
        // Positive double, normalized or denormalized.
        // Incrementing the largest positive double
        // produces +infinity.

        ++u.i;
    }
    else
    {
        // Negative normalized or denormalized double.

        --u.i;
    }

    return u.d;
}